

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

usize __thiscall Console::Prompt::Private::getScreenWidth(Private *this)

{
  int iVar1;
  ssize_t sVar2;
  char *__buf;
  usize uVar3;
  usize uVar4;
  undefined1 local_68 [8];
  String moveCmd;
  usize newY;
  usize newX;
  usize y;
  usize x;
  winsize ws;
  Private *this_local;
  
  ws = (winsize)this;
  iVar1 = ioctl(originalStdout,0x5413,&x);
  if ((iVar1 == 0) && (x._2_2_ != 0)) {
    this_local = (Private *)(ulong)x._2_2_;
  }
  else {
    getCursorPosition(this,&y,&newX);
    sVar2 = write(originalStdout,"\x1b[999C",6);
    if (sVar2 == 6) {
      getCursorPosition(this,&newY,&moveCmd._data.ref);
      if (CONCAT44(y._4_4_,(int)y) < CONCAT44(newY._4_4_,(int)newY)) {
        String::String((String *)local_68);
        String::printf((String *)local_68,"\x1b[%dD",(ulong)(uint)((int)newY - (int)y));
        iVar1 = originalStdout;
        __buf = String::operator_cast_to_char_((String *)local_68);
        uVar3 = String::length((String *)local_68);
        uVar3 = write(iVar1,__buf,uVar3);
        uVar4 = String::length((String *)local_68);
        if (uVar3 != uVar4) {
          this_local = (Private *)0x50;
        }
        String::~String((String *)local_68);
        if (uVar3 != uVar4) {
          return (usize)this_local;
        }
      }
      this_local = (Private *)(CONCAT44(newY._4_4_,(int)newY) + 1);
    }
    else {
      this_local = (Private *)0x50;
    }
  }
  return (usize)this_local;
}

Assistant:

usize getScreenWidth()
  {
#ifdef _MSC_VER
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
    return csbi.dwSize.X;
#else
    winsize ws;
    if(ioctl(originalStdout, TIOCGWINSZ, &ws) == 0)
      if(ws.ws_col)
        return ws.ws_col;
    usize x, y;
    getCursorPosition(x, y);
    if(write(originalStdout, "\x1b[999C", 6) != 6)
      return 80;
    usize newX, newY;
    getCursorPosition(newX, newY);
    if(newX > x)
    {
      String moveCmd;
      moveCmd.printf("\x1b[%dD", (int)(newX - x));
      if(write(originalStdout, (const char*)moveCmd, moveCmd.length()) != (ssize)moveCmd.length())
        return 80;
    }
    return newX + 1;
#endif
  }